

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textfile.h
# Opt level: O0

bool __thiscall TextFile::readLine(TextFile *this,string *line)

{
  ssize_t sVar1;
  size_t in_RCX;
  byte local_33;
  bool local_32;
  char local_21;
  int readCnt;
  char ch;
  string *line_local;
  TextFile *this_local;
  
  _readCnt = line;
  line_local = (string *)this;
  std::__cxx11::string::operator=((string *)line,"");
  do {
    sVar1 = File::read(&this->super_File,(int)&local_21,(void *)0x1,in_RCX);
    local_32 = false;
    if ((int)sVar1 == 1) {
      in_RCX = (size_t)(uint)(int)local_21;
      local_32 = (int)local_21 == 10 || local_21 == '\r';
    }
  } while (local_32);
  if ((int)sVar1 == 1) {
    if ((local_21 != '\n') && (local_21 != '\r')) {
      std::__cxx11::string::operator+=((string *)_readCnt,local_21);
    }
    while( true ) {
      sVar1 = File::read(&this->super_File,(int)&local_21,(void *)0x1,in_RCX);
      if ((((int)sVar1 != 1) || (local_21 == '\n')) || (local_21 == '\r')) break;
      std::__cxx11::string::operator+=((string *)_readCnt,local_21);
    }
    local_33 = 1;
    if ((int)sVar1 != 1) {
      local_33 = std::__cxx11::string::empty();
      local_33 = local_33 ^ 0xff;
    }
    this_local._7_1_ = (bool)(local_33 & 1);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool readLine(std::string& line) const
    {
        line = "";
        char ch;
        int readCnt;
        do
        {
            readCnt = read(&ch, 1);
        } while (readCnt == 1 && (ch == '\n' || ch == '\r'));
        if (readCnt != 1)
            return false;
        if (ch != '\n' && ch != '\r')
            line += ch;
        while (true)
        {
            readCnt = read(&ch, 1);
            if (readCnt == 1 && ch != '\n' && ch != '\r')
                line += ch;
            else
                break;
        }
        return readCnt == 1 || !line.empty();
    }